

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

RealType __thiscall OpenMD::Thermo::getElectronicKinetic(Thermo *this)

{
  SnapshotManager *this_00;
  StuntDouble *in_RDI;
  RealType RVar1;
  RealType kinetic;
  RealType cmass;
  RealType cvel;
  Atom *atom;
  Molecule *mol;
  iterator iiter;
  MoleculeIterator miter;
  Snapshot *snap;
  double local_48;
  iterator *in_stack_ffffffffffffffc8;
  SimInfo *in_stack_ffffffffffffffd0;
  Molecule *local_28;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18;
  Snapshot *local_10;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI->_vptr_StuntDouble);
  local_10 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((local_10->hasElectronicKineticEnergy & 1U) == 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_18);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_20);
    local_48 = 0.0;
    local_28 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffffd0,(MoleculeIterator *)in_stack_ffffffffffffffc8);
    while (local_28 != (Molecule *)0x0) {
      for (in_stack_ffffffffffffffd0 =
                (SimInfo *)
                Molecule::beginFluctuatingCharge
                          ((Molecule *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
          in_stack_ffffffffffffffd0 != (SimInfo *)0x0;
          in_stack_ffffffffffffffd0 =
               (SimInfo *)
               Molecule::nextFluctuatingCharge
                         ((Molecule *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)) {
        RVar1 = Atom::getChargeMass((Atom *)in_stack_ffffffffffffffd0);
        in_stack_ffffffffffffffc8 = (iterator *)StuntDouble::getFlucQVel(in_RDI);
        local_48 = RVar1 * (double)in_stack_ffffffffffffffc8 * (double)in_stack_ffffffffffffffc8 +
                   local_48;
      }
      local_28 = SimInfo::nextMolecule((SimInfo *)0x0,(MoleculeIterator *)in_stack_ffffffffffffffc8)
      ;
    }
    Snapshot::setElectronicKineticEnergy(local_10,local_48 * 0.5);
  }
  RVar1 = Snapshot::getElectronicKineticEnergy(local_10);
  return RVar1;
}

Assistant:

RealType Thermo::getElectronicKinetic() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasElectronicKineticEnergy) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator iiter;
      Molecule* mol;
      Atom* atom;
      RealType cvel;
      RealType cmass;
      RealType kinetic(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginFluctuatingCharge(iiter); atom != NULL;
             atom = mol->nextFluctuatingCharge(iiter)) {
          cmass = atom->getChargeMass();
          cvel  = atom->getFlucQVel();
          kinetic += cmass * cvel * cvel;
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &kinetic, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      kinetic *= 0.5;
      snap->setElectronicKineticEnergy(kinetic);
    }

    return snap->getElectronicKineticEnergy();
  }